

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O0

void secp256k1_musig_keyaggcoef_internal
               (secp256k1_scalar *r,uchar *pks_hash,secp256k1_ge *pk,secp256k1_ge *second_pk)

{
  int iVar1;
  int ret;
  size_t buflen;
  uchar buf [33];
  secp256k1_sha256 sha;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  secp256k1_scalar *in_stack_ffffffffffffff40;
  int *overflow;
  secp256k1_ge *in_stack_ffffffffffffff48;
  secp256k1_sha256 *in_stack_ffffffffffffff50;
  secp256k1_ge *in_stack_ffffffffffffff60;
  secp256k1_ge *in_stack_ffffffffffffff68;
  
  iVar1 = secp256k1_ge_is_infinity((secp256k1_ge *)0x11f0c4);
  if ((iVar1 == 0) &&
     (iVar1 = secp256k1_ge_eq_var(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60), iVar1 != 0))
  {
    secp256k1_scalar_set_int(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    return;
  }
  overflow = (int *)0x21;
  secp256k1_musig_keyaggcoef_sha256((secp256k1_sha256 *)0x11f10d);
  secp256k1_sha256_write
            (in_stack_ffffffffffffff50,(uchar *)in_stack_ffffffffffffff48,(size_t)overflow);
  secp256k1_eckey_pubkey_serialize
            (in_stack_ffffffffffffff48,(uchar *)overflow,
             (size_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
  secp256k1_sha256_write
            (in_stack_ffffffffffffff50,(uchar *)in_stack_ffffffffffffff48,(size_t)overflow);
  secp256k1_sha256_finalize(in_stack_ffffffffffffff50,(uchar *)in_stack_ffffffffffffff48);
  secp256k1_scalar_set_b32
            ((secp256k1_scalar *)in_stack_ffffffffffffff50,(uchar *)in_stack_ffffffffffffff48,
             overflow);
  return;
}

Assistant:

static void secp256k1_musig_keyaggcoef_internal(secp256k1_scalar *r, const unsigned char *pks_hash, secp256k1_ge *pk, const secp256k1_ge *second_pk) {
    VERIFY_CHECK(!secp256k1_ge_is_infinity(pk));

    if (!secp256k1_ge_is_infinity(second_pk)
          && secp256k1_ge_eq_var(pk, second_pk)) {
        secp256k1_scalar_set_int(r, 1);
    } else {
        secp256k1_sha256 sha;
        unsigned char buf[33];
        size_t buflen = sizeof(buf);
        int ret;
        secp256k1_musig_keyaggcoef_sha256(&sha);
        secp256k1_sha256_write(&sha, pks_hash, 32);
        ret = secp256k1_eckey_pubkey_serialize(pk, buf, &buflen, 1);
#ifdef VERIFY
        /* Serialization does not fail since the pk is not the point at infinity
         * (according to this function's precondition). */
        VERIFY_CHECK(ret && buflen == sizeof(buf));
#else
        (void) ret;
#endif
        secp256k1_sha256_write(&sha, buf, sizeof(buf));
        secp256k1_sha256_finalize(&sha, buf);
        secp256k1_scalar_set_b32(r, buf, NULL);
    }
}